

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::short_filename_formatter<spdlog::details::null_scoped_padder>::format
          (short_filename_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_3,memory_buf_t *dest)

{
  string_view_t view;
  bool bVar1;
  memory_buf_t *in_RCX;
  long in_RSI;
  basic_string_view<char> *in_RDI;
  null_scoped_padder p;
  size_t text_size;
  char *filename;
  char *s;
  memory_buf_t *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  char *pcVar2;
  
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (!bVar1) {
    basename(*(char **)(in_RSI + 0x38));
    bVar1 = padding_info::enabled((padding_info *)&in_RDI->size_);
    if (bVar1) {
      s = (char *)std::char_traits<char>::length((char_type *)0x1d95cc);
    }
    else {
      s = (char *)0x0;
    }
    pcVar2 = s;
    null_scoped_padder::null_scoped_padder
              ((null_scoped_padder *)&stack0xffffffffffffffcf,(size_t)s,
               (padding_info *)&in_RDI->size_,in_RCX);
    ::fmt::v6::basic_string_view<char>::basic_string_view(in_RDI,s);
    view.size_ = (size_t)pcVar2;
    view.data_ = in_stack_ffffffffffffffc8;
    fmt_helper::append_string_view(view,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        if (msg.source.empty())
        {
            return;
        }
        auto filename = basename(msg.source.filename);
        size_t text_size = padinfo_.enabled() ? std::char_traits<char>::length(filename) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(filename, dest);
    }